

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

bool __thiscall
libtorrent::torrent_info::resolve_duplicate_filenames_slow
          (torrent_info *this,int max_duplicate_filenames,error_code *ec)

{
  pointer pbVar1;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *crc_00;
  size_type sVar2;
  pointer pcVar3;
  _Hash_node_base *p_Var4;
  libtorrent *this_00;
  __node_base_ptr p_Var5;
  undefined1 auVar6 [8];
  __node_base _Var7;
  undefined4 uVar8;
  size_t sVar9;
  char cVar10;
  file_flags_t fVar11;
  uint h;
  int iVar12;
  uint uVar13;
  uint32_t uVar14;
  long lVar15;
  size_type __bkt_count;
  _Hash_node_base *p_Var16;
  int64_t iVar17;
  int64_t iVar18;
  __node_base_ptr p_Var19;
  uint uVar20;
  __hash_code __code;
  pointer pbVar21;
  file_index_t fVar22;
  uint uVar23;
  file_index_t index;
  _Alloc_hider _Var24;
  _Hash_node_base *in_R9;
  _Hash_node_base *p_Var25;
  ulong uVar26;
  size_type sVar27;
  torrent_info *this_01;
  bool bVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  error_code eVar32;
  string_view str;
  string_view lhs;
  string_view s2;
  string_view str_00;
  string_view rhs;
  string_view s1;
  string other_name;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc_1;
  string base;
  string filename;
  unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
  files;
  crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> crc;
  string ext;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  local_1a8;
  undefined1 local_198 [8];
  uint local_190;
  undefined4 uStack_18c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [2];
  ulong local_160;
  uint local_154;
  pointer local_150;
  torrent_info *local_148;
  string local_140;
  string local_120;
  int local_fc;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  local_f8;
  uint local_c0;
  undefined4 uStack_bc;
  char *local_b8;
  long local_b0 [2];
  string local_a0;
  undefined8 local_80;
  int iStack_78;
  long local_70 [2];
  ulong local_60;
  error_code *local_58;
  string local_50;
  
  local_f8._M_buckets = &local_f8._M_single_bucket;
  local_f8._M_bucket_count = 1;
  local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f8._M_element_count = 0;
  local_f8._M_rehash_policy._M_max_load_factor = 1.0;
  local_f8._M_rehash_policy._M_next_resize = 0;
  local_f8._M_single_bucket = (__node_base_ptr)0x0;
  pbVar21 = (this->m_files).m_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = (this->m_files).m_paths.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_148 = this;
  local_fc = max_duplicate_filenames;
  local_58 = ec;
  iVar12 = file_storage::num_files(&this->m_files);
  lVar15 = (long)iVar12 + ((long)pbVar21 - (long)pbVar1 >> 5);
  auVar30._8_4_ = (int)((ulong)lVar15 >> 0x20);
  auVar30._0_8_ = lVar15;
  auVar30._12_4_ = 0x45300000;
  dVar29 = (double)local_f8._M_rehash_policy._M_max_load_factor;
  ceil(((auVar30._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) / dVar29);
  sVar9 = local_f8._M_rehash_policy._M_next_resize;
  local_198._0_4_ = (undefined4)local_f8._M_rehash_policy._M_next_resize;
  local_198._4_4_ = (undefined4)(local_f8._M_rehash_policy._M_next_resize >> 0x20);
  lVar15 = local_f8._M_element_count + 1;
  auVar31._8_4_ = (int)((ulong)lVar15 >> 0x20);
  auVar31._0_8_ = lVar15;
  auVar31._12_4_ = 0x45300000;
  ceil(((auVar31._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) / dVar29);
  __bkt_count = ::std::__detail::_Prime_rehash_policy::_M_next_bkt
                          ((ulong)&local_f8._M_rehash_policy);
  if (__bkt_count != local_f8._M_bucket_count) {
    ::std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
    ::_M_rehash(&local_f8,__bkt_count,(__rehash_state *)local_198);
    sVar9 = local_f8._M_rehash_policy._M_next_resize;
  }
  local_f8._M_rehash_policy._M_next_resize = sVar9;
  this_01 = local_148;
  uVar13 = 0x80000000;
  uVar20 = 1;
  str._M_str._0_4_ = 0xffffffff;
  do {
    uVar23 = uVar13 | uVar20;
    str_00._M_str._0_4_ = uVar23;
    if ((uVar23 & (uint)str._M_str) != uVar20) {
      str_00._M_str._0_4_ = 0;
    }
    if ((uVar23 & (uint)str._M_str) == uVar13) {
      str_00._M_str._0_4_ = uVar23;
    }
    str._M_str._0_4_ = (uint)str._M_str ^ (uint)str_00._M_str;
    uVar13 = uVar13 >> 1;
    uVar20 = uVar20 * 2;
  } while (uVar20 < uVar13);
  crc_00 = (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
           (local_148->m_files).m_name._M_string_length;
  local_c0 = (uint)str._M_str;
  if (crc_00 != (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)0x0) {
    str._M_len = (size_t)(local_148->m_files).m_name._M_dataplus._M_p;
    str._M_str._4_4_ = 0;
    (anonymous_namespace)::
    process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
              ((_anonymous_namespace_ *)&local_c0,crc_00,str);
  }
  uVar20 = local_c0;
  pbVar21 = (this_01->m_files).m_paths.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_150 = (this_01->m_files).m_paths.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar21 != local_150) {
    uVar13 = 0xffffffff;
    do {
      str._M_str._0_4_ = uVar20;
      if (pbVar21->_M_string_length != 0) {
        local_198[0] = 0x2f;
        str._M_str._0_4_ =
             boost::detail::reflected_byte_table_driven_crcs<32,_517762881UL>::crc_update
                       (uVar20,local_198,1);
      }
      uVar26 = (ulong)uVar13;
      sVar2 = pbVar21->_M_string_length;
      local_160 = uVar26;
      if (sVar2 != 0) {
        pcVar3 = (pbVar21->_M_dataplus)._M_p;
        sVar27 = 0;
        do {
          cVar10 = pcVar3[sVar27];
          if (cVar10 == '/') {
            local_198._0_4_ = ~(uint)str._M_str;
            local_198._4_4_ = (undefined4)uVar26;
            local_190 = (uint)(uVar26 >> 0x20);
            ::std::
            unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
            ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                      *)&local_f8,(value_type *)local_198);
          }
          cVar10 = aux::to_lower(cVar10);
          local_198[0] = cVar10;
          str._M_str._0_4_ =
               boost::detail::reflected_byte_table_driven_crcs<32,_517762881UL>::crc_update
                         ((uint)str._M_str,local_198,1);
          sVar27 = sVar27 + 1;
          uVar26 = uVar26 + 0x100000000;
        } while (sVar2 != sVar27);
      }
      local_198._0_4_ = ~(uint)str._M_str;
      local_190 = (uint)pbVar21->_M_string_length | (uint)(local_160 >> 0x20);
      local_198._4_4_ = (undefined4)local_160;
      uVar8 = local_198._4_4_;
      ::std::
      unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
      ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                *)&local_f8,(value_type *)local_198);
      uVar13 = uVar8 - 1;
      pbVar21 = pbVar21 + 1;
      this_01 = local_148;
    } while (pbVar21 != local_150);
  }
  local_1a8 = file_storage::file_range(&this_01->m_files);
  local_60 = (ulong)local_1a8 >> 0x20;
  bVar28 = local_1a8._begin.m_val.m_val == local_1a8._end.m_val.m_val;
  local_150 = (pointer)CONCAT71(local_150._1_7_,bVar28);
  _Var7._M_nxt = local_f8._M_before_begin._M_nxt;
  if (bVar28) {
joined_r0x00371a32:
    while (_Var7._M_nxt != (_Hash_node_base *)0x0) {
      p_Var25 = (_Var7._M_nxt)->_M_nxt;
      operator_delete(_Var7._M_nxt,0x18);
      _Var7._M_nxt = p_Var25;
    }
    memset(local_f8._M_buckets,0,local_f8._M_bucket_count << 3);
    local_f8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_f8._M_element_count = 0;
    if (&local_f8._M_single_bucket != local_f8._M_buckets) {
      operator_delete(local_f8._M_buckets,local_f8._M_bucket_count << 3);
    }
    return (bool)((byte)local_150 & 1);
  }
  local_160 = 0;
LAB_0037142c:
  local_198 = (undefined1  [8])local_188;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
  index.m_val = (int)local_1a8._begin.m_val;
  uVar14 = file_storage::file_path_hash(&this_01->m_files,index,(string *)local_198);
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198,local_188[0]._M_allocated_capacity + 1);
  }
  p_Var25 = local_f8._M_buckets[(ulong)uVar14 % local_f8._M_bucket_count];
  p_Var16 = (_Hash_node_base *)0x0;
  if ((p_Var25 != (_Hash_node_base *)0x0) &&
     (p_Var16 = p_Var25, p_Var4 = p_Var25->_M_nxt, uVar14 != *(uint32_t *)&p_Var25->_M_nxt[1]._M_nxt
     )) {
    while (in_R9 = p_Var4, p_Var4 = in_R9->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var16 = (_Hash_node_base *)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % local_f8._M_bucket_count !=
           (ulong)uVar14 % local_f8._M_bucket_count) ||
         (p_Var16 = in_R9, uVar14 == *(uint *)&p_Var4[1]._M_nxt)) goto LAB_003714d5;
    }
    p_Var16 = (_Hash_node_base *)0x0;
  }
LAB_003714d5:
  if (p_Var16 == (_Hash_node_base *)0x0) {
    p_Var25 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var25 = p_Var16->_M_nxt;
  }
  p_Var16 = p_Var25;
  if (p_Var25 != (_Hash_node_base *)0x0) {
    do {
      p_Var16 = p_Var16->_M_nxt;
      if (p_Var16 == (_Hash_node_base *)0x0) break;
    } while (*(int *)&p_Var25[1]._M_nxt == *(int *)&p_Var16[1]._M_nxt);
  }
  do {
    if (p_Var25 == p_Var16) break;
    fVar22.m_val = (int)*(undefined8 *)((long)&p_Var25[1]._M_nxt + 4);
    if (fVar22.m_val < 0) {
      pcVar3 = (this_01->m_files).m_name._M_dataplus._M_p;
      this_00 = (libtorrent *)(this_01->m_files).m_name._M_string_length;
      ::std::__cxx11::string::substr
                ((ulong)&local_c0,
                 (ulong)((this_01->m_files).m_paths.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (~fVar22.m_val & 0x7fffffff)));
      rhs._M_len._4_4_ = uStack_bc;
      rhs._M_len._0_4_ = local_c0;
      lhs._M_str = local_b8;
      lhs._M_len = (size_t)pcVar3;
      rhs._M_str = (char *)in_R9;
      combine_path_abi_cxx11_((string *)local_198,this_00,lhs,rhs);
      _Var24._M_p = (pointer)CONCAT44(uStack_bc,local_c0);
      lVar15 = local_b0[0];
      auVar6 = local_198;
      if ((long *)_Var24._M_p != local_b0) goto LAB_003715ec;
    }
    else {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      file_storage::file_path((string *)local_198,&this_01->m_files,fVar22,&local_a0);
      auVar6 = local_198;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        lVar15 = CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                          local_a0.field_2._M_local_buf[0]);
        _Var24._M_p = local_a0._M_dataplus._M_p;
LAB_003715ec:
        operator_delete(_Var24._M_p,lVar15 + 1);
        auVar6 = local_198;
      }
    }
    s1._M_len._4_4_ = uStack_18c;
    s1._M_len._0_4_ = local_190;
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_198 = auVar6;
    file_storage::file_path(&local_120,&this_01->m_files,index,&local_140);
    s2._M_str = local_120._M_dataplus._M_p;
    s2._M_len = local_120._M_string_length;
    s1._M_str = (char *)auVar6;
    bVar28 = aux::string_equal_no_case(s1,s2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188[0]._M_allocated_capacity + 1);
    }
    if (bVar28) break;
    p_Var25 = p_Var25->_M_nxt;
  } while( true );
  if (p_Var25 == p_Var16) {
    local_190 = 0;
    local_198._0_4_ = uVar14;
    local_198._4_4_ = index.m_val;
    ::std::
    unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
    ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
              *)&local_f8,(value_type *)local_198);
    iVar12 = 9;
  }
  else {
    fVar22.m_val = *(int *)((long)&p_Var25[1]._M_nxt + 4);
    if (-1 < fVar22.m_val) {
      fVar11 = file_storage::file_flags(&this_01->m_files,index);
      if ((fVar11.m_val & 1) != 0) {
        fVar11 = file_storage::file_flags(&this_01->m_files,fVar22);
        if ((fVar11.m_val & 1) != 0) {
          iVar17 = file_storage::file_size(&this_01->m_files,index);
          iVar18 = file_storage::file_size(&this_01->m_files,fVar22);
          iVar12 = 9;
          if (iVar17 == iVar18) goto LAB_00371a02;
        }
      }
    }
    local_198 = (undefined1  [8])local_188;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"");
    file_storage::file_path(&local_120,&this_01->m_files,index,(string *)local_198);
    if (local_198 != (undefined1  [8])local_188) {
      operator_delete((void *)local_198,local_188[0]._M_allocated_capacity + 1);
    }
    remove_extension(&local_140,&local_120);
    extension(&local_50,&local_120);
    uVar26 = 0;
    do {
      uVar26 = (ulong)((int)uVar26 + 1);
      snprintf((char *)local_198,0x32,".%d%s",uVar26,local_50._M_dataplus._M_p);
      local_80 = local_70;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_140._M_dataplus._M_p,
                 local_140._M_dataplus._M_p + local_140._M_string_length);
      ::std::__cxx11::string::append((char *)&local_80);
      ::std::__cxx11::string::operator=((string *)&local_120,(string *)&local_80);
      if (local_80 != local_70) {
        operator_delete(local_80,local_70[0] + 1);
      }
      uVar13 = 0x80000000;
      uVar20 = 1;
      str_00._M_str._0_4_ = 0xffffffff;
      do {
        uVar23 = uVar13 | uVar20;
        str._M_str._0_4_ = uVar23;
        if ((uVar23 & (uint)str_00._M_str) != uVar20) {
          str._M_str._0_4_ = 0;
        }
        if ((uVar23 & (uint)str_00._M_str) == uVar13) {
          str._M_str._0_4_ = uVar23;
        }
        str_00._M_str._0_4_ = (uint)str_00._M_str ^ (uint)str._M_str;
        uVar13 = uVar13 >> 1;
        uVar20 = uVar20 * 2;
      } while (uVar20 < uVar13);
      str_00._M_len = (size_t)local_120._M_dataplus._M_p;
      str_00._M_str._4_4_ = 0;
      local_154 = (uint)str_00._M_str;
      (anonymous_namespace)::
      process_string_lowercase<boost::crc_optimal<32ul,517762881u,4294967295u,4294967295u,true,true>>
                ((_anonymous_namespace_ *)&local_154,
                 (crc_optimal<32UL,_517762881U,_4294967295U,_4294967295U,_true,_true> *)
                 local_120._M_string_length,str_00);
      uVar20 = ~local_154;
      p_Var5 = local_f8._M_buckets[(ulong)uVar20 % local_f8._M_bucket_count];
      p_Var19 = (__node_base_ptr)0x0;
      if ((p_Var5 != (__node_base_ptr)0x0) &&
         (in_R9 = p_Var5->_M_nxt, p_Var19 = p_Var5, p_Var25 = in_R9,
         *(uint *)&in_R9[1]._M_nxt != uVar20)) {
        while (in_R9 = p_Var25->_M_nxt, in_R9 != (_Hash_node_base *)0x0) {
          p_Var19 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&in_R9[1]._M_nxt % local_f8._M_bucket_count !=
               (ulong)uVar20 % local_f8._M_bucket_count) ||
             (p_Var19 = p_Var25, p_Var25 = in_R9, *(uint *)&in_R9[1]._M_nxt == uVar20))
          goto LAB_003718c2;
        }
        p_Var19 = (__node_base_ptr)0x0;
      }
LAB_003718c2:
      if ((p_Var19 == (__node_base_ptr)0x0) || (p_Var19->_M_nxt == (_Hash_node_base *)0x0)) {
        iStack_78 = 0;
        local_80._0_4_ = uVar20;
        local_80._4_4_ = index.m_val;
        ::std::
        unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
        ::insert((unordered_multimap<unsigned_int,_libtorrent::(anonymous_namespace)::name_entry,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_libtorrent::(anonymous_namespace)::name_entry>_>_>
                  *)&local_f8,(value_type *)&local_80);
        iVar12 = 10;
      }
      else {
        uVar20 = (int)local_160 + 1;
        iVar12 = 0;
        if ((int)local_160 < local_fc) {
          local_160 = (ulong)uVar20;
          this_01 = local_148;
        }
        else {
          eVar32 = errors::make_error_code(too_many_duplicate_filenames);
          local_58->val_ = eVar32.val_;
          local_58->failed_ = eVar32.failed_;
          *(int3 *)&local_58->field_0x5 = eVar32._5_3_;
          local_58->cat_ = eVar32.cat_;
          (local_148->m_files).m_piece_length = 0;
          iVar12 = 1;
          local_160 = (ulong)uVar20;
          this_01 = local_148;
        }
      }
    } while (iVar12 == 0);
    if (iVar12 == 10) {
      copy_on_write(this_01);
      iVar12 = 0;
      file_storage::rename_file(&this_01->m_files,index,&local_120);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
  }
LAB_00371a02:
  _Var7._M_nxt = local_f8._M_before_begin._M_nxt;
  if ((iVar12 != 9) && (iVar12 != 0)) goto joined_r0x00371a32;
  local_1a8._begin.m_val = index.m_val + 1;
  local_1a8._end.m_val = 0;
  local_150 = (pointer)CONCAT71(local_150._1_7_,local_1a8._begin.m_val == (uint)local_60);
  if (local_1a8._begin.m_val == (uint)local_60) goto joined_r0x00371a32;
  goto LAB_0037142c;
}

Assistant:

bool torrent_info::resolve_duplicate_filenames_slow(
		int const max_duplicate_filenames, error_code& ec)
	{
		INVARIANT_CHECK;

		// maps filename hash to file index
		// or, if the file_index is negative, maps into the paths vector
		std::unordered_multimap<std::uint32_t, name_entry> files;

		std::vector<std::string> const& paths = m_files.paths();
		files.reserve(paths.size() + aux::numeric_cast<std::size_t>(m_files.num_files()));

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		{
			boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
			if (!m_files.name().empty())
			{
				process_string_lowercase(crc, m_files.name());
			}
			file_index_t path_index{-1};
			for (auto const& path : paths)
			{
				auto local_crc = crc;
				if (!path.empty()) local_crc.process_byte(TORRENT_SEPARATOR);
				int count = 0;
				for (char const c : path)
				{
					if (c == TORRENT_SEPARATOR)
						files.insert({local_crc.checksum(), {path_index, count}});
					local_crc.process_byte(aux::to_lower(c) & 0xff);
					++count;
				}
				files.insert({local_crc.checksum(), {path_index, int(path.size())}});
				--path_index;
			}
		}

		// keep track of the total number of name collisions. If there are too
		// many, it's probably a malicious torrent and we should just fail
		int num_collisions = 0;
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const hash = m_files.file_path_hash(i, "");
			auto range = files.equal_range(hash);
			auto const match = std::find_if(range.first, range.second, [&](std::pair<std::uint32_t, name_entry> const& o)
			{
				std::string const other_name = o.second.idx < file_index_t{}
					? combine_path(m_files.name(), paths[std::size_t(-static_cast<int>(o.second.idx)-1)].substr(0, std::size_t(o.second.length)))
					: m_files.file_path(o.second.idx);
				return aux::string_equal_no_case(other_name, m_files.file_path(i));
			});

			if (match == range.second)
			{
				files.insert({hash, {i, 0}});
				continue;
			}

			// pad files are allowed to collide with each-other, as long as they have
			// the same size.
			file_index_t const other_idx = match->second.idx;
			if (other_idx >= file_index_t{}
				&& (m_files.file_flags(i) & file_storage::flag_pad_file)
				&& (m_files.file_flags(other_idx) & file_storage::flag_pad_file)
				&& m_files.file_size(i) == m_files.file_size(other_idx))
				continue;

			std::string filename = m_files.file_path(i);
			std::string base = remove_extension(filename);
			std::string ext = extension(filename);
			int cnt = 0;
			for (;;)
			{
				++cnt;
				char new_ext[50];
				std::snprintf(new_ext, sizeof(new_ext), ".%d%s", cnt, ext.c_str());
				filename = base + new_ext;

				boost::crc_optimal<32, 0x1EDC6F41, 0xFFFFFFFF, 0xFFFFFFFF, true, true> crc;
				process_string_lowercase(crc, filename);
				std::uint32_t const new_hash = crc.checksum();
				if (files.find(new_hash) == files.end())
				{
					files.insert({new_hash, {i, 0}});
					break;
				}
				++num_collisions;
				if (num_collisions > max_duplicate_filenames)
				{
					ec = errors::too_many_duplicate_filenames;
					// mark the torrent as invalid
					m_files.set_piece_length(0);
					return false;
				}
			}

			copy_on_write();
			m_files.rename_file(i, filename);
		}
		return true;
	}